

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readTypes(WasmBinaryReader *this)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer pFVar6;
  size_t sVar7;
  _Storage<wasm::HeapType,_true> _Var8;
  Type TVar9;
  Type TVar10;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  mapped_type *pmVar11;
  ostream *poVar12;
  Struct *pSVar13;
  mapped_type *pmVar14;
  ParseException *pPVar15;
  Fatal *this_00;
  pointer pHVar16;
  ulong uVar17;
  __node_base *p_Var18;
  _Hash_node_base _Var19;
  char *pcVar20;
  __node_base *p_Var21;
  pair<wasm::HeapType,_wasm::Exactness> pVar22;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  Signature signature;
  Name name;
  Name name_00;
  undefined1 local_330 [8];
  anon_class_24_3_475464a4 makeType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  anon_class_16_2_dbef1248 readHeapType;
  anon_class_8_1_8991fb9c readMutability;
  anon_class_24_3_948d3139 readFieldDef;
  FieldList fields;
  undefined1 local_a0 [8];
  anon_class_16_2_f7b3316f readType;
  Field local_80;
  TypeBuilder local_70;
  TypeBuilder builder;
  BuildResult result;
  pointer local_40;
  
  uVar5 = getU32LEB(this);
  TypeBuilder::TypeBuilder(&local_70,(ulong)uVar5);
  makeType.this = (WasmBinaryReader *)local_258;
  readFieldDef.readMutability = (anon_class_8_1_8991fb9c *)local_330;
  readFieldDef.this = (WasmBinaryReader *)&readHeapType.builder;
  local_330 = (undefined1  [8])this;
  makeType.readHeapType = (anon_class_16_2_dbef1248 *)&local_70;
  local_258 = (undefined1  [8])this;
  readHeapType.this = (WasmBinaryReader *)&local_70;
  readHeapType.builder = (TypeBuilder *)this;
  readMutability.this = this;
  local_a0 = (undefined1  [8])readFieldDef.readMutability;
  readType.makeType = (anon_class_24_3_475464a4 *)this;
  for (local_40 = (pointer)0x0; pFVar6 = (pointer)TypeBuilder::size(&local_70), local_40 < pFVar6;
      local_40 = (pointer)((long)&(local_40->type).id + 1)) {
    bVar3 = getInt8(this);
    if (bVar3 == 0x4e) {
      uVar5 = getU32LEB(this);
      if (uVar5 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&makeType.builder,"Recursion groups of size zero not supported",
                   (allocator<char> *)&readFieldDef.makeType);
        throwError(this,(string *)&makeType.builder);
      }
      TypeBuilder::grow(&local_70,(ulong)(uVar5 - 1));
      TypeBuilder::createRecGroup(&local_70,(size_t)local_40,(ulong)uVar5);
      bVar3 = getInt8(this);
    }
    if ((byte)(bVar3 + 0xb1) < 2) {
      if (bVar3 == 0x50) {
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = local_40;
        readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
        TypeBuilder::Entry::setOpen((Entry *)&readFieldDef.makeType,true);
      }
      uVar5 = getU32LEB(this);
      if (uVar5 != 0) {
        if (uVar5 != 1) {
          std::__cxx11::to_string((string *)&builder,uVar5);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readFieldDef.makeType,"Invalid type definition with ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &builder);
          std::operator+(&local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readFieldDef.makeType," supertypes");
          throwError(this,&local_2f8);
        }
        uVar5 = getU32LEB(this);
        sVar7 = TypeBuilder::size(&local_70);
        if (sVar7 <= uVar5) {
          std::__cxx11::to_string((string *)&readFieldDef.makeType,uVar5);
          std::operator+(&local_2d8,"invalid supertype index: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readFieldDef.makeType);
          throwError(this,&local_2d8);
        }
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = local_40;
        readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
        builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
             (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             &local_70;
        result.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = (ulong)uVar5;
        _Var8._M_value = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&builder);
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var8;
        TypeBuilder::Entry::subTypeOf((Entry *)&readFieldDef.makeType,other);
      }
      bVar3 = getInt8(this);
    }
    if (bVar3 == 0x65) {
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      TypeBuilder::Entry::setShared((Entry *)&readFieldDef.makeType,Shared);
      bVar3 = getInt8(this);
    }
    if (bVar3 == 0x4c) {
      uVar5 = getU32LEB(this);
      sVar7 = TypeBuilder::size(&local_70);
      if (sVar7 <= uVar5) {
        std::__cxx11::to_string((string *)&readFieldDef.makeType,uVar5);
        std::operator+(&local_2b8,"invalid described type index: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &readFieldDef.makeType);
        throwError(this,&local_2b8);
      }
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           &local_70;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = (ulong)uVar5;
      _Var8._M_value = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&builder);
      other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
      other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
           (HeapType)(HeapType)_Var8;
      TypeBuilder::Entry::describes((Entry *)&readFieldDef.makeType,other_00);
      bVar3 = getInt8(this);
    }
    if (bVar3 == 0x4d) {
      uVar5 = getU32LEB(this);
      sVar7 = TypeBuilder::size(&local_70);
      if (sVar7 <= uVar5) {
        std::__cxx11::to_string((string *)&readFieldDef.makeType,uVar5);
        std::operator+(&local_298,"invalid descriptor type index: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &readFieldDef.makeType);
        throwError(this,&local_298);
      }
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           &local_70;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = (ulong)uVar5;
      _Var8._M_value = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&builder);
      other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
      other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
           (HeapType)(HeapType)_Var8;
      TypeBuilder::Entry::descriptor((Entry *)&readFieldDef.makeType,other_01);
      bVar3 = getInt8(this);
    }
    switch(bVar3) {
    case 0x5d:
      pVar22 = readTypes::anon_class_16_2_dbef1248::operator()
                         ((anon_class_16_2_dbef1248 *)local_258);
      builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           pVar22.first.id;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_4_
           = pVar22.second;
      if (pVar22.second != Inexact) {
        pPVar15 = (ParseException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&readFieldDef.makeType,"invalid exact type in cont definition",
                   (allocator<char> *)&local_80);
        ParseException::ParseException(pPVar15,(string *)&readFieldDef.makeType);
        __cxa_throw(pPVar15,&ParseException::typeinfo,ParseException::~ParseException);
      }
      bVar4 = HeapType::isSignature((HeapType *)&builder);
      if (!bVar4) {
        pPVar15 = (ParseException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&readFieldDef.makeType,"cont types must be built from function types",
                   (allocator<char> *)&local_80);
        ParseException::ParseException(pPVar15,(string *)&readFieldDef.makeType);
        __cxa_throw(pPVar15,&ParseException::typeinfo,ParseException::~ParseException);
      }
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      TypeBuilder::Entry::operator=
                ((Entry *)&readFieldDef.makeType,
                 (Continuation)
                 builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
      break;
    case 0x5e:
      join_0x00000010_0x00000000_ =
           readTypes::anon_class_24_3_948d3139::operator()
                     ((anon_class_24_3_948d3139 *)&readMutability);
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      TypeBuilder::Entry::operator=((Entry *)&readFieldDef.makeType,(Array *)&readType.this);
      break;
    case 0x5f:
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar5 = getU32LEB(this);
      uVar17 = (ulong)uVar5;
      while (bVar4 = uVar17 != 0, uVar17 = uVar17 - 1, bVar4) {
        local_80 = readTypes::anon_class_24_3_948d3139::operator()
                             ((anon_class_24_3_948d3139 *)&readMutability);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::emplace_back<wasm::Field>
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&readFieldDef.makeType,
                   &local_80);
      }
      builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           readFieldDef.makeType;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_
           = fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&readFieldDef.makeType);
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      TypeBuilder::Entry::operator=((Entry *)&readFieldDef.makeType,(Struct *)&builder);
      std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&builder);
      break;
    case 0x60:
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )0x0;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = 0;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_
           = 0;
      uVar5 = getU32LEB(this);
      uVar17 = (ulong)uVar5;
      while (bVar4 = uVar17 != 0, uVar17 = uVar17 - 1, bVar4) {
        TVar9 = readTypes::anon_class_16_2_f7b3316f::operator()
                          ((anon_class_16_2_f7b3316f *)local_a0);
        local_80.type.id = TVar9.id;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&readFieldDef.makeType,
                   &local_80.type);
      }
      uVar5 = getU32LEB(this);
      uVar17 = (ulong)uVar5;
      while (bVar4 = uVar17 != 0, uVar17 = uVar17 - 1, bVar4) {
        TVar9 = readTypes::anon_class_16_2_f7b3316f::operator()
                          ((anon_class_16_2_f7b3316f *)local_a0);
        local_80.type.id = TVar9.id;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&builder,&local_80.type);
      }
      TVar9 = TypeBuilder::getTempTupleType(&local_70,(Tuple *)&readFieldDef.makeType);
      TVar10 = TypeBuilder::getTempTupleType(&local_70,(Tuple *)&builder);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&builder);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&readFieldDef.makeType);
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = local_40;
      signature.results.id = TVar10.id;
      signature.params.id = TVar9.id;
      readFieldDef.makeType = (anon_class_24_3_475464a4 *)&local_70;
      TypeBuilder::Entry::operator=((Entry *)&readFieldDef.makeType,signature);
      break;
    default:
      std::__cxx11::to_string((string *)&readFieldDef.makeType,(uint)bVar3);
      std::operator+(&local_278,"Bad type form ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &readFieldDef.makeType);
      throwError(this,&local_278);
    }
  }
  TypeBuilder::build((BuildResult *)&builder,&local_70);
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\x01') {
    Fatal::Fatal((Fatal *)&readFieldDef.makeType);
    std::operator<<((ostream *)
                    &fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_finish,"Invalid type: ");
    this_00 = Fatal::operator<<((Fatal *)&readFieldDef.makeType,(ErrorReason *)&result);
    std::operator<<((ostream *)&this_00->field_0x10," at index ");
    Fatal::operator<<(this_00,(unsigned_long *)&builder);
    Fatal::~Fatal((Fatal *)&readFieldDef.makeType);
  }
  __x = std::
        get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                  ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    *)&builder);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=(&this->types,__x);
  uVar17 = 0;
  while( true ) {
    pHVar16 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->types).
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pHVar16 >> 3) <= uVar17) break;
    readFieldDef.makeType = (anon_class_24_3_475464a4 *)pHVar16[uVar17].id;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar17);
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->wasm->typeIndices,&readFieldDef.makeType);
    uVar17 = (ulong)((int)uVar17 + 1);
  }
  p_Var18 = &(this->typeNames)._M_h._M_before_begin;
  while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
    pHVar16 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uint)*(size_type *)(p_Var18 + 1) <
        (ulong)((long)(this->types).
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pHVar16 >> 3)) {
      pmVar11 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->wasm->typeNames,pHVar16 + (uint)*(size_type *)(p_Var18 + 1));
      _Var19._M_nxt = p_Var18[3]._M_nxt;
      (pmVar11->name).super_IString.str._M_len =
           (size_t)*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var18 + 2))->_M_max_load_factor
      ;
      (pmVar11->name).super_IString.str._M_str = (char *)_Var19._M_nxt;
    }
    else {
      poVar12 = std::operator<<((ostream *)&std::cerr,
                                "warning: type index out of bounds in name section: ");
      name.super_IString.str._M_str = (char *)pHVar16;
      name.super_IString.str._M_len = (size_t)p_Var18[3]._M_nxt;
      poVar12 = wasm::operator<<((wasm *)poVar12,
                                 *(ostream **)
                                  &((_Prime_rehash_policy *)(p_Var18 + 2))->_M_max_load_factor,name)
      ;
      poVar12 = std::operator<<(poVar12," at index ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::operator<<(poVar12,'\n');
    }
  }
  p_Var21 = &(this->fieldNames)._M_h._M_before_begin;
  do {
    while( true ) {
      p_Var21 = p_Var21->_M_nxt;
      if (p_Var21 == (__node_base *)0x0) {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             *)&builder);
        TypeBuilder::~TypeBuilder(&local_70);
        return;
      }
      pHVar16 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pcVar20 = "warning: type index out of bounds in name section: fields at index ";
      if ((ulong)(uint)*(size_type *)(p_Var21 + 1) <
          (ulong)((long)(this->types).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pHVar16 >> 3)) break;
LAB_00cc219e:
      poVar12 = std::operator<<((ostream *)&std::cerr,pcVar20);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::operator<<(poVar12,'\n');
    }
    bVar4 = HeapType::isStruct(pHVar16 + (uint)*(size_type *)(p_Var21 + 1));
    pcVar20 = "warning: field names applied to non-struct type at index ";
    if (!bVar4) goto LAB_00cc219e;
    pmVar11 = std::__detail::
              _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->wasm->typeNames,
                           (this->types).
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (uint)*(size_type *)(p_Var21 + 1));
    _Var19._M_nxt = p_Var21 + 4;
    while (_Var19._M_nxt = (_Var19._M_nxt)->_M_nxt, _Var19._M_nxt != (_Hash_node_base *)0x0) {
      uVar1 = *(uint *)&_Var19._M_nxt[1]._M_nxt;
      pSVar13 = HeapType::getStruct((this->types).
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    (uint)*(size_type *)(p_Var21 + 1));
      pcVar20 = (char *)((long)(pSVar13->fields).
                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)(pSVar13->fields).
                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                               .super__Vector_impl_data._M_start >> 4);
      if ((char *)(ulong)uVar1 < pcVar20) {
        pmVar14 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pmVar11->fieldNames,(key_type *)(_Var19._M_nxt + 1));
        p_Var2 = _Var19._M_nxt[3]._M_nxt;
        (pmVar14->super_IString).str._M_len = (size_t)_Var19._M_nxt[2]._M_nxt;
        (pmVar14->super_IString).str._M_str = (char *)p_Var2;
      }
      else {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "warning: field index out of bounds in name section: ");
        name_00.super_IString.str._M_str = pcVar20;
        name_00.super_IString.str._M_len = (size_t)_Var19._M_nxt[3]._M_nxt;
        poVar12 = wasm::operator<<((wasm *)poVar12,(ostream *)_Var19._M_nxt[2]._M_nxt,name_00);
        poVar12 = std::operator<<(poVar12," at index ");
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        poVar12 = std::operator<<(poVar12," in type ");
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::operator<<(poVar12,'\n');
      }
    }
  } while( true );
}

Assistant:

void WasmBinaryReader::readTypes() {
  TypeBuilder builder(getU32LEB());

  auto readHeapType = [&]() -> std::pair<HeapType, Exactness> {
    int64_t htCode = getS64LEB(); // TODO: Actually s33
    auto exactness = Inexact;
    if (htCode == BinaryConsts::EncodedType::ExactLEB) {
      exactness = Exact;
      htCode = getS64LEB(); // TODO: Actually s33
    }
    if (htCode >= 0) {
      if (size_t(htCode) >= builder.size()) {
        throwError("invalid type index: " + std::to_string(htCode));
      }
      return {builder.getTempHeapType(size_t(htCode)), exactness};
    }
    if (exactness == Exact) {
      throwError("invalid type index: " + std::to_string(htCode));
    }
    auto share = Unshared;
    if (htCode == BinaryConsts::EncodedType::SharedLEB) {
      share = Shared;
      htCode = getS64LEB(); // TODO: Actually s33
    }
    HeapType ht;
    if (getBasicHeapType(htCode, ht)) {
      return {ht.getBasic(share), Inexact};
    }
    throwError("invalid wasm heap type: " + std::to_string(htCode));
  };
  auto makeType = [&](int32_t typeCode) {
    Type type;
    if (getBasicType(typeCode, type)) {
      return type;
    }

    switch (typeCode) {
      case BinaryConsts::EncodedType::nullable:
      case BinaryConsts::EncodedType::nonnullable: {
        auto nullability = typeCode == BinaryConsts::EncodedType::nullable
                             ? Nullable
                             : NonNullable;

        auto [ht, exactness] = readHeapType();
        if (ht.isBasic()) {
          return Type(ht, nullability, exactness);
        }

        return builder.getTempRefType(ht, nullability, exactness);
      }
      default:
        throwError("unexpected type index: " + std::to_string(typeCode));
    }
    WASM_UNREACHABLE("unexpected type");
  };
  auto readType = [&]() { return makeType(getS32LEB()); };

  auto readSignatureDef = [&]() {
    std::vector<Type> params;
    std::vector<Type> results;
    size_t numParams = getU32LEB();
    for (size_t j = 0; j < numParams; j++) {
      params.push_back(readType());
    }
    auto numResults = getU32LEB();
    for (size_t j = 0; j < numResults; j++) {
      results.push_back(readType());
    }
    return Signature(builder.getTempTupleType(params),
                     builder.getTempTupleType(results));
  };

  auto readContinuationDef = [&]() {
    auto [ht, exactness] = readHeapType();
    if (exactness != Inexact) {
      throw ParseException("invalid exact type in cont definition");
    }
    if (!ht.isSignature()) {
      throw ParseException("cont types must be built from function types");
    }
    return Continuation(ht);
  };

  auto readMutability = [&]() {
    switch (getU32LEB()) {
      case 0:
        return Immutable;
      case 1:
        return Mutable;
      default:
        throw ParseException("Expected 0 or 1 for mutability");
    }
  };

  auto readFieldDef = [&]() {
    // The value may be a general wasm type, or one of the types only possible
    // in a field.
    auto typeCode = getS32LEB();
    if (typeCode == BinaryConsts::EncodedType::i8) {
      auto mutable_ = readMutability();
      return Field(Field::i8, mutable_);
    }
    if (typeCode == BinaryConsts::EncodedType::i16) {
      auto mutable_ = readMutability();
      return Field(Field::i16, mutable_);
    }
    // It's a regular wasm value.
    auto type = makeType(typeCode);
    auto mutable_ = readMutability();
    return Field(type, mutable_);
  };

  auto readStructDef = [&]() {
    FieldList fields;
    size_t numFields = getU32LEB();
    for (size_t j = 0; j < numFields; j++) {
      fields.push_back(readFieldDef());
    }
    return Struct(std::move(fields));
  };

  for (size_t i = 0; i < builder.size(); i++) {
    auto form = getInt8();
    if (form == BinaryConsts::EncodedType::Rec) {
      uint32_t groupSize = getU32LEB();
      if (groupSize == 0u) {
        // TODO: Support groups of size zero by shrinking the builder.
        throwError("Recursion groups of size zero not supported");
      }
      // The group counts as one element in the type section, so we have to
      // allocate space for the extra types.
      builder.grow(groupSize - 1);
      builder.createRecGroup(i, groupSize);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Sub ||
        form == BinaryConsts::EncodedType::SubFinal) {
      if (form == BinaryConsts::EncodedType::Sub) {
        builder[i].setOpen();
      }
      uint32_t supers = getU32LEB();
      if (supers > 0) {
        if (supers != 1) {
          throwError("Invalid type definition with " + std::to_string(supers) +
                     " supertypes");
        }
        auto superIdx = getU32LEB();
        if (superIdx >= builder.size()) {
          throwError("invalid supertype index: " + std::to_string(superIdx));
        }
        builder[i].subTypeOf(builder[superIdx]);
      }
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Shared) {
      builder[i].setShared();
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Describes) {
      auto descIdx = getU32LEB();
      if (descIdx >= builder.size()) {
        throwError("invalid described type index: " + std::to_string(descIdx));
      }
      builder[i].describes(builder[descIdx]);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Descriptor) {
      auto descIdx = getU32LEB();
      if (descIdx >= builder.size()) {
        throwError("invalid descriptor type index: " + std::to_string(descIdx));
      }
      builder[i].descriptor(builder[descIdx]);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Func) {
      builder[i] = readSignatureDef();
    } else if (form == BinaryConsts::EncodedType::Cont) {
      builder[i] = readContinuationDef();
    } else if (form == BinaryConsts::EncodedType::Struct) {
      builder[i] = readStructDef();
    } else if (form == BinaryConsts::EncodedType::Array) {
      builder[i] = Array(readFieldDef());
    } else {
      throwError("Bad type form " + std::to_string(form));
    }
  }

  auto result = builder.build();
  if (auto* err = result.getError()) {
    Fatal() << "Invalid type: " << err->reason << " at index " << err->index;
  }
  types = std::move(*result);

  // Record the type indices.
  for (Index i = 0; i < types.size(); ++i) {
    wasm.typeIndices.insert({types[i], i});
  }

  // Assign names from the names section.
  for (auto& [index, name] : typeNames) {
    if (index >= types.size()) {
      std::cerr << "warning: type index out of bounds in name section: " << name
                << " at index " << index << '\n';
      continue;
    }
    wasm.typeNames[types[index]].name = name;
  }
  for (auto& [index, fields] : fieldNames) {
    if (index >= types.size()) {
      std::cerr
        << "warning: type index out of bounds in name section: fields at index "
        << index << '\n';
      continue;
    }
    if (!types[index].isStruct()) {
      std::cerr << "warning: field names applied to non-struct type at index "
                << index << '\n';
      continue;
    }
    auto& names = wasm.typeNames[types[index]].fieldNames;
    for (auto& [field, name] : fields) {
      if (field >= types[index].getStruct().fields.size()) {
        std::cerr << "warning: field index out of bounds in name section: "
                  << name << " at index " << field << " in type " << index
                  << '\n';
        continue;
      }
      names[field] = name;
    }
  }
}